

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O0

QString * __thiscall QSystemSemaphore::key(QSystemSemaphore *this)

{
  QNativeIpcKey *in_RDI;
  
  std::unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>::
  operator->((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_> *)
             0x2652c9);
  QNativeIpcKeyPrivate::legacyKey(in_RDI);
  return (QString *)in_RDI;
}

Assistant:

QString QSystemSemaphore::key() const
{
    return QNativeIpcKeyPrivate::legacyKey(d->nativeKey);
}